

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O0

bool DecodeBase64PSBT(PartiallySignedTransaction *psbt,string *base64_tx,string *error)

{
  long lVar1;
  bool bVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  long in_FS_OFFSET;
  optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> tx_data;
  optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  PartiallySignedTransaction *in_stack_ffffffffffffffa0;
  undefined1 local_29;
  string_view in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff88);
  DecodeBase64(in_stack_ffffffffffffffe0);
  bVar2 = std::optional::operator_cast_to_bool(in_stack_ffffffffffffff68);
  if (bVar2) {
    std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::operator*
              (in_stack_ffffffffffffff68);
    MakeByteSpan<std::vector<unsigned_char,std::allocator<unsigned_char>>&>(in_RDI);
    local_29 = DecodeRawPSBT(in_stack_ffffffffffffffa0,
                             (Span<const_std::byte>)in_stack_ffffffffffffffe0,
                             (string *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                            );
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff78,
               (char *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    local_29 = false;
  }
  std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~optional
            (in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_29;
  }
  __stack_chk_fail();
}

Assistant:

bool DecodeBase64PSBT(PartiallySignedTransaction& psbt, const std::string& base64_tx, std::string& error)
{
    auto tx_data = DecodeBase64(base64_tx);
    if (!tx_data) {
        error = "invalid base64";
        return false;
    }
    return DecodeRawPSBT(psbt, MakeByteSpan(*tx_data), error);
}